

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall Assembler::processIfOneOpReg(Assembler *this,string *line,int reg)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  byte *pbVar5;
  char cVar6;
  Assembler *pAVar7;
  string *this_00;
  byte local_72;
  allocator<char> local_71;
  undefined1 local_70 [32];
  
  bVar2 = std::operator==(line,"int");
  cVar6 = (char)reg;
  if ((!bVar2) && (bVar2 = std::operator==(line,"not"), !bVar2)) {
    bVar2 = std::operator==(line,"pop");
    if (bVar2) {
      pmVar1 = &this->codeBySection;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
      local_72 = (byte)locationCounter;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
      pbVar5 = (byte *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[](&this->instrDescription,line);
      local_72 = *pbVar5;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
      local_72 = cVar6 << 4 | 6;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
      pAVar7 = (Assembler *)&stack0xffffffffffffffb0;
      std::__cxx11::string::string<std::allocator<char>>((string *)pAVar7,"0x42",&local_71);
      iVar3 = literalToDecimal(pAVar7,(string *)&stack0xffffffffffffffb0);
      local_72 = (byte)iVar3;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
      this_00 = (string *)&stack0xffffffffffffffb0;
    }
    else {
      bVar2 = std::operator==(line,"push");
      if (!bVar2) {
        return;
      }
      pmVar1 = &this->codeBySection;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
      local_72 = (byte)locationCounter;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
      pbVar5 = (byte *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[](&this->instrDescription,line);
      local_72 = *pbVar5;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
      local_72 = cVar6 << 4 | 6;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
      pAVar7 = (Assembler *)local_70;
      std::__cxx11::string::string<std::allocator<char>>((string *)pAVar7,"0x12",&local_71);
      iVar3 = literalToDecimal(pAVar7,(string *)local_70);
      local_72 = (byte)iVar3;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
      this_00 = (string *)local_70;
    }
    std::__cxx11::string::~string(this_00);
    return;
  }
  pmVar1 = &this->codeBySection;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
  local_72 = (byte)locationCounter;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
  pbVar5 = (byte *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](&this->instrDescription,line);
  local_72 = *pbVar5;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&currentSectionName_abi_cxx11_);
  local_72 = cVar6 << 4 | 0xf;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar4,(char *)&local_72);
  return;
}

Assistant:

void Assembler::processIfOneOpReg(string line, int reg) {
    if (line == "int") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 15);

    } else if (line == "not") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 15);

    } else if (line == "pop") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 6);
        codeBySection[currentSectionName].push_back(literalToDecimal("0x42"));

    } else if (line == "push") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 6);
        codeBySection[currentSectionName].push_back(literalToDecimal("0x12"));

    }

    return;

}